

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

bool kj::tryCopyDirectoryEntry
               (Directory *to,PathPtr toPath,WriteMode toMode,ReadableDirectory *from,
               PathPtr fromPath,Type type,bool atomic)

{
  Replacer<kj::File> *pRVar1;
  Directory *pDVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar4;
  undefined8 unaff_RBP;
  String *pSVar5;
  Replacer<kj::File> *pRVar6;
  undefined1 uVar7;
  Own<kj::Directory::Replacer<kj::File>_> replacer;
  undefined8 uStack_70;
  OwnOwn<const_kj::ReadableFile> fromFile;
  Own<const_kj::Directory> local_40;
  
  sVar4 = toPath.parts.size_;
  pSVar5 = toPath.parts.ptr;
  if (type == SYMLINK) {
    (*(from->super_FsNode)._vptr_FsNode[0xc])
              ((Replacer<kj::File> *)&replacer,from,fromPath.parts.ptr,fromPath.parts.size_);
    pRVar1 = replacer.ptr;
    fromFile.value.disposer =
         (Disposer *)CONCAT71(fromFile.value.disposer._1_7_,(char)replacer.disposer);
    pRVar6 = (Replacer<kj::File> *)&replacer;
    if ((char)replacer.disposer == '\x01') {
      fromFile.value.ptr = (ReadableFile *)replacer.ptr;
      replacer.ptr = (Replacer<kj::File> *)0x0;
      unaff_RBP = uStack_70;
      pRVar6 = pRVar1;
    }
    _::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&replacer);
    if ((char)replacer.disposer == '\0') {
      uVar7 = 0;
    }
    else {
      if (unaff_RBP == 0) {
        pRVar6 = (Replacer<kj::File> *)0x2b02ed;
      }
      iVar3 = (*(to->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x13])
                        (to,pSVar5,sVar4,pRVar6,unaff_RBP + (ulong)(unaff_RBP == 0),(ulong)toMode);
      uVar7 = (undefined1)iVar3;
    }
    _::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&fromFile);
  }
  else if (type == DIRECTORY) {
    (*(from->super_FsNode)._vptr_FsNode[0xb])
              (&replacer,from,fromPath.parts.ptr,fromPath.parts.size_);
    pRVar1 = replacer.ptr;
    fromFile.value.disposer = replacer.disposer;
    fromFile.value.ptr = (ReadableFile *)replacer.ptr;
    replacer.ptr = (Replacer<kj::File> *)0x0;
    Own<const_kj::ReadableDirectory>::dispose((Own<const_kj::ReadableDirectory> *)&replacer);
    if (pRVar1 == (Replacer<kj::File> *)0x0) {
      uVar7 = 0;
    }
    else if (atomic) {
      (*(to->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x12])
                (&replacer,to,pSVar5,sVar4,(ulong)toMode);
      iVar3 = (**(replacer.ptr)->_vptr_Replacer)();
      copyContents((Directory *)CONCAT44(extraout_var_00,iVar3),
                   (ReadableDirectory *)fromFile.value.ptr);
      iVar3 = (*(replacer.ptr)->_vptr_Replacer[1])();
      uVar7 = (undefined1)iVar3;
      Own<kj::Directory::Replacer<kj::Directory>_>::dispose
                ((Own<kj::Directory::Replacer<kj::Directory>_> *)&replacer);
    }
    else {
      (*(to->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x11])
                (&local_40,to,pSVar5,sVar4,(ulong)toMode);
      pDVar2 = local_40.ptr;
      replacer.disposer = local_40.disposer;
      replacer.ptr = (Replacer<kj::File> *)local_40.ptr;
      local_40.ptr = (Directory *)0x0;
      Own<const_kj::Directory>::dispose(&local_40);
      uVar7 = (Replacer<kj::File> *)pDVar2 != (Replacer<kj::File> *)0x0;
      if ((bool)uVar7) {
        copyContents(pDVar2,(ReadableDirectory *)fromFile.value.ptr);
      }
      Own<const_kj::Directory>::dispose((Own<const_kj::Directory> *)&replacer);
    }
    Own<const_kj::ReadableDirectory>::dispose((Own<const_kj::ReadableDirectory> *)&fromFile);
  }
  else if (type == FILE) {
    (*(from->super_FsNode)._vptr_FsNode[10])(&replacer,from,fromPath.parts.ptr,fromPath.parts.size_)
    ;
    pRVar1 = replacer.ptr;
    fromFile.value.disposer = replacer.disposer;
    fromFile.value.ptr = (ReadableFile *)replacer.ptr;
    replacer.ptr = (Replacer<kj::File> *)0x0;
    Own<const_kj::ReadableFile>::dispose((Own<const_kj::ReadableFile> *)&replacer);
    if (pRVar1 == (Replacer<kj::File> *)0x0) {
      uVar7 = 0;
    }
    else if (atomic) {
      (*(to->super_ReadableDirectory).super_FsNode._vptr_FsNode[0xe])
                (&replacer,to,pSVar5,sVar4,(ulong)toMode);
      iVar3 = (**(replacer.ptr)->_vptr_Replacer)();
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x68))
                ((long *)CONCAT44(extraout_var,iVar3),0,fromFile.value.ptr,0,0xffffffffffffffff);
      iVar3 = (*(replacer.ptr)->_vptr_Replacer[1])();
      uVar7 = (undefined1)iVar3;
      Own<kj::Directory::Replacer<kj::File>_>::dispose(&replacer);
    }
    else {
      (*(to->super_ReadableDirectory).super_FsNode._vptr_FsNode[0xd])
                (&local_40,to,pSVar5,sVar4,(ulong)toMode);
      pDVar2 = local_40.ptr;
      replacer.disposer = local_40.disposer;
      replacer.ptr = (Replacer<kj::File> *)local_40.ptr;
      local_40.ptr = (Directory *)0x0;
      Own<const_kj::File>::dispose((Own<const_kj::File> *)&local_40);
      uVar7 = (Replacer<kj::File> *)pDVar2 != (Replacer<kj::File> *)0x0;
      if ((bool)uVar7) {
        (*(*(_func_int ***)&pDVar2->super_ReadableDirectory)[0xd])
                  (pDVar2,0,fromFile.value.ptr,0,0xffffffffffffffff);
      }
      Own<const_kj::File>::dispose((Own<const_kj::File> *)&replacer);
    }
    Own<const_kj::ReadableFile>::dispose(&fromFile.value);
  }
  else {
    uVar7 = 0;
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[47],kj::PathPtr&>
              ((Fault *)&fromFile,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,700,FAILED,(char *)0x0,
               "\"can only copy files, directories, and symlinks\", fromPath",
               (char (*) [47])"can only copy files, directories, and symlinks",&fromPath);
    _::Debug::Fault::~Fault((Fault *)&fromFile);
  }
  return (bool)uVar7;
}

Assistant:

static bool tryCopyDirectoryEntry(const Directory& to, PathPtr toPath, WriteMode toMode,
                                  const ReadableDirectory& from, PathPtr fromPath,
                                  FsNode::Type type, bool atomic) {
  // TODO(cleanup): Make this reusable?

  switch (type) {
    case FsNode::Type::FILE: {
      KJ_IF_MAYBE(fromFile, from.tryOpenFile(fromPath)) {
        if (atomic) {
          auto replacer = to.replaceFile(toPath, toMode);
          replacer->get().copy(0, **fromFile, 0, kj::maxValue);
          return replacer->tryCommit();
        } else KJ_IF_MAYBE(toFile, to.tryOpenFile(toPath, toMode)) {
          toFile->get()->copy(0, **fromFile, 0, kj::maxValue);
          return true;
        } else {
          return false;
        }
      } else {
        // Apparently disappeared. Treat as source-doesn't-exist.
        return false;
      }
    }
    case FsNode::Type::DIRECTORY:
      KJ_IF_MAYBE(fromSubdir, from.tryOpenSubdir(fromPath)) {
        if (atomic) {
          auto replacer = to.replaceSubdir(toPath, toMode);
          copyContents(replacer->get(), **fromSubdir);
          return replacer->tryCommit();
        } else KJ_IF_MAYBE(toSubdir, to.tryOpenSubdir(toPath, toMode)) {
          copyContents(**toSubdir, **fromSubdir);
          return true;
        } else {
          return false;
        }
      } else {
        // Apparently disappeared. Treat as source-doesn't-exist.
        return false;
      }
    case FsNode::Type::SYMLINK:
      KJ_IF_MAYBE(content, from.tryReadlink(fromPath)) {
        return to.trySymlink(toPath, *content, toMode);
      } else {
        // Apparently disappeared. Treat as source-doesn't-exist.
        return false;
      }
      break;

    default:
      // Note: Unclear whether it's better to throw an error here or just ignore it / log a
      //   warning. Can reconsider when we see an actual use case.
      KJ_FAIL_REQUIRE("can only copy files, directories, and symlinks", fromPath) {
        return false;
      }
  }
}